

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantPool.cc
# Opt level: O3

size_t __thiscall flow::ConstantPool::makeIPAddress(ConstantPool *this,IPAddress *value)

{
  Family FVar1;
  int iVar2;
  long lVar3;
  size_t __n;
  iterator __position;
  size_t sVar4;
  pointer pIVar5;
  IPAddress *pIVar6;
  byte bVar7;
  
  bVar7 = 0;
  pIVar6 = (this->ipaddrs_).
           super__Vector_base<flow::util::IPAddress,_std::allocator<flow::util::IPAddress>_>._M_impl
           .super__Vector_impl_data._M_start;
  __position._M_current =
       (this->ipaddrs_).
       super__Vector_base<flow::util::IPAddress,_std::allocator<flow::util::IPAddress>_>._M_impl.
       super__Vector_impl_data._M_finish;
  lVar3 = (long)__position._M_current - (long)pIVar6;
  if (lVar3 != 0) {
    FVar1 = value->family_;
    __n = 0x10;
    if (FVar1 == V4) {
      __n = 4;
    }
    sVar4 = 0;
    do {
      if (pIVar6 == value) {
        return sVar4;
      }
      if ((pIVar6->family_ == FVar1) && (iVar2 = bcmp(pIVar6->buf_,value->buf_,__n), iVar2 == 0)) {
        return sVar4;
      }
      sVar4 = sVar4 + 1;
      pIVar6 = pIVar6 + 1;
    } while ((lVar3 >> 2) * -0xf0f0f0f0f0f0f0f - sVar4 != 0);
  }
  if (__position._M_current ==
      (this->ipaddrs_).
      super__Vector_base<flow::util::IPAddress,_std::allocator<flow::util::IPAddress>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<flow::util::IPAddress,std::allocator<flow::util::IPAddress>>::
    _M_realloc_insert<flow::util::IPAddress_const&>
              ((vector<flow::util::IPAddress,std::allocator<flow::util::IPAddress>> *)
               &this->ipaddrs_,__position,value);
    pIVar5 = (this->ipaddrs_).
             super__Vector_base<flow::util::IPAddress,_std::allocator<flow::util::IPAddress>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    for (lVar3 = 0x11; lVar3 != 0; lVar3 = lVar3 + -1) {
      (__position._M_current)->family_ = value->family_;
      value = (IPAddress *)((long)value + (ulong)bVar7 * -8 + 4);
      __position._M_current = __position._M_current + (ulong)bVar7 * -8 + 4;
    }
    pIVar5 = (this->ipaddrs_).
             super__Vector_base<flow::util::IPAddress,_std::allocator<flow::util::IPAddress>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
    (this->ipaddrs_).
    super__Vector_base<flow::util::IPAddress,_std::allocator<flow::util::IPAddress>_>._M_impl.
    super__Vector_impl_data._M_finish = pIVar5;
  }
  return ((long)pIVar5 -
          (long)(this->ipaddrs_).
                super__Vector_base<flow::util::IPAddress,_std::allocator<flow::util::IPAddress>_>.
                _M_impl.super__Vector_impl_data._M_start >> 2) * -0xf0f0f0f0f0f0f0f - 1;
}

Assistant:

size_t ConstantPool::makeIPAddress(const util::IPAddress& value) {
  return ensureValue(ipaddrs_, value);
}